

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNUnit.cpp
# Opt level: O0

NaReal __thiscall NaNNUnit::DerivActFunc(NaNNUnit *this,uint iLayer,NaReal z)

{
  uint uVar1;
  uint in_ESI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar2;
  NaReal f;
  double local_20;
  
  uVar1 = OutputLayer((NaNNUnit *)0x148461);
  if ((uVar1 == in_ESI) && ((int)in_RDI[0x15] == 0)) {
    local_20 = 1.0;
  }
  else {
    dVar2 = (double)(**(code **)(*in_RDI + 0x80))(in_XMM0_Qa,in_RDI,in_ESI);
    local_20 = (-dVar2 * dVar2 + 1.0) * 0.5;
  }
  return local_20;
}

Assistant:

NaReal
NaNNUnit::DerivActFunc (unsigned iLayer, NaReal z)
{
    NaReal  f;
    if(OutputLayer() == iLayer && descr.eLastActFunc == afkLinear){
        // Linear transfer derivation
        f = 1.;
    }
    else /* sigmoid */{
        f = ActFunc(iLayer, z);
        f = 0.5 * (1. - f * f);
    }
    return f;
}